

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRHandler.cc
# Opt level: O3

void __thiscall flow::IRHandler::erase(IRHandler *this,BasicBlock *bb)

{
  pointer puVar1;
  TerminateInstr *pTVar2;
  size_t in_RCX;
  uchar *extraout_RDX;
  uchar *sig;
  uchar *extraout_RDX_00;
  list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
  *this_00;
  uchar *in_R8;
  size_t in_R9;
  pointer puVar3;
  iterator __position;
  _List_node_base *p_Var4;
  _func_int **local_30;
  
  this_00 = &this->blocks_;
  for (__position._M_node =
            (this->blocks_).
            super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
            ._M_impl._M_node.super__List_node_base._M_next;
      (__position._M_node != (_List_node_base *)this_00 &&
      ((BasicBlock *)__position._M_node[1]._M_next != bb));
      __position._M_node = (__position._M_node)->_M_next) {
  }
  if (__position._M_node != (_List_node_base *)this_00) {
    puVar1 = (bb->code_).
             super__Vector_base<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar3 = (bb->code_).
                  super__Vector_base<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1)
    {
      Instr::clearOperands
                ((puVar3->_M_t).
                 super___uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_>._M_t.
                 super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
                 super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl);
    }
    pTVar2 = BasicBlock::getTerminator(bb);
    if (pTVar2 != (TerminateInstr *)0x0) {
      BasicBlock::remove((BasicBlock *)&stack0xffffffffffffffd0,
                         (char *)__position._M_node[1]._M_next);
      if (local_30 != (_func_int **)0x0) {
        (**(code **)(*local_30 + 8))();
      }
      local_30 = (_func_int **)0x0;
    }
    std::__cxx11::
    list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
    ::_M_erase(this_00,__position);
    return;
  }
  erase();
  sig = extraout_RDX;
  for (p_Var4 = (this->blocks_).
                super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var4 != (_List_node_base *)&this->blocks_; p_Var4 = p_Var4->_M_next) {
    BasicBlock::verify((BasicBlock *)p_Var4[1]._M_next,(EVP_PKEY_CTX *)bb,sig,in_RCX,in_R8,in_R9);
    sig = extraout_RDX_00;
  }
  return;
}

Assistant:

void IRHandler::erase(BasicBlock* bb) {
  auto i = std::find_if(blocks_.begin(), blocks_.end(),
                        [&](const auto& obj) { return obj.get() == bb; });
  FLOW_ASSERT(i != blocks_.end(),
              "Given basic block must be a member of this handler to be removed.");

  for (Instr* instr : bb->instructions()) {
    instr->clearOperands();
  }

  if (TerminateInstr* terminator = bb->getTerminator()) {
    (*i)->remove(terminator);
  }

  blocks_.erase(i);
}